

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O0

fiobj_type_enum fiobj_type(FIOBJ o)

{
  FIOBJ o_local;
  
  if (o == 0) {
    o_local._7_1_ = FIOBJ_T_NULL;
  }
  else if ((o & 1) == 0) {
    if ((o & 6) == 6) {
      o_local._7_1_ = (fiobj_type_enum)o;
    }
    else if ((o & 6) == 2) {
      o_local._7_1_ = FIOBJ_T_STRING;
    }
    else if ((o & 6) == 4) {
      o_local._7_1_ = FIOBJ_T_HASH;
    }
    else {
      o_local._7_1_ = *(fiobj_type_enum *)(o & 0xfffffffffffffff8);
    }
  }
  else {
    o_local._7_1_ = FIOBJ_T_NUMBER;
  }
  return o_local._7_1_;
}

Assistant:

size_t __attribute__((weak)) fio_ftoa(char *dest, double num, uint8_t base) {
  if (base == 2 || base == 16) {
    /* handle the binary / Hex representation the same as if it were an
     * int64_t
     */
    int64_t *i = (void *)&num;
    return fio_ltoa(dest, *i, base);
  }

  size_t written = sprintf(dest, "%g", num);
  uint8_t need_zero = 1;
  char *start = dest;
  while (*start) {
    if (*start == ',') // locale issues?
      *start = '.';
    if (*start == '.' || *start == 'e') {
      need_zero = 0;
      break;
    }
    start++;
  }
  if (need_zero) {
    dest[written++] = '.';
    dest[written++] = '0';
  }
  return written;
}